

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O2

void * soa_fsa_alloc(soa_fsa_t *allocator)

{
  soa_chunk_t *__ptr;
  size_t sVar1;
  soa_chunk_t *psVar2;
  void *pvVar3;
  size_t __size;
  bool bVar4;
  
  psVar2 = allocator->allocChunk;
  if ((psVar2 == (soa_chunk_t *)0x0) || (psVar2->freeBlocks == '\0')) {
    allocator->allocChunk = (soa_chunk_t *)0x0;
    __ptr = allocator->chunks;
    sVar1 = allocator->chunks_len;
    psVar2 = __ptr;
    while (bVar4 = sVar1 != 0, sVar1 = sVar1 - 1, bVar4) {
      if (psVar2->freeBlocks != '\0') goto LAB_001395ab;
      psVar2 = psVar2 + 1;
    }
    sVar1 = allocator->chunks_len + 1;
    allocator->chunks_len = sVar1;
    __size = sVar1 * 0x10;
    if (__ptr == (soa_chunk_t *)0x0) {
      psVar2 = (soa_chunk_t *)malloc(__size);
    }
    else {
      psVar2 = (soa_chunk_t *)realloc(__ptr,__size);
    }
    if (psVar2 == (soa_chunk_t *)0x0) {
      return (void *)0x0;
    }
    if (psVar2 != allocator->chunks) {
      allocator->allocChunk = (soa_chunk_t *)0x0;
      allocator->deallocChunk = (soa_chunk_t *)0x0;
    }
    allocator->chunks = psVar2;
    psVar2 = psVar2 + (allocator->chunks_len - 1);
    soa_chunk_init(psVar2,allocator->blockSize,allocator->numBlocks);
LAB_001395ab:
    allocator->allocChunk = psVar2;
  }
  if (psVar2->freeBlocks != '\0') {
    pvVar3 = soa_chunk_alloc(psVar2,allocator->blockSize);
    return pvVar3;
  }
  __assert_fail("allocator->allocChunk->freeBlocks > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_fsa.c"
                ,0x5c,"void *soa_fsa_alloc(soa_fsa_t *)");
}

Assistant:

void * soa_fsa_alloc( soa_fsa_t *allocator )
{
  if((allocator->allocChunk == 0) || (allocator->allocChunk->freeBlocks == 0 ) ) //No free blocks in this chunk or no chunk available
  {
    //linear search through all chunks to find a free block
    size_t i;
    soa_chunk_t *chunk;
    allocator->allocChunk = 0; //invalidate allocChunk
    for(i=0,chunk=allocator->chunks;i<allocator->chunks_len;i++,chunk++)
    {
      if(chunk->freeBlocks > 0) //space available?
      {
        allocator->allocChunk = chunk;
        break;
      }
    }
    if(allocator->allocChunk == 0) //We still have not found a chunk with a free block?
    {
      soa_chunk_t *ptr;
      //grow chunk array by one
      allocator->chunks_len++;
      if (allocator->chunks == 0)
      {
         ptr = (soa_chunk_t*) malloc(allocator->chunks_len * sizeof(soa_chunk_t));
      }
      else
      {
         ptr = (soa_chunk_t*) realloc(allocator->chunks,allocator->chunks_len * sizeof(soa_chunk_t));
      }

      if(ptr)
      {
        if(ptr != allocator->chunks)
        {
          //The memory has moved, all pointers into allocator->chunks must be invalidated
          allocator->allocChunk = 0;
          allocator->deallocChunk = 0;
        }
        allocator->chunks = ptr;
        chunk = allocator->chunks+allocator->chunks_len-1; //pointer to last chunk
        soa_chunk_init(chunk,allocator->blockSize,allocator->numBlocks); //call constructor on newly created chunk
        allocator->allocChunk = chunk;
      }
      else
      {
        return (void*) 0;
      }
    }
  }
  assert(allocator->allocChunk);
  assert(allocator->allocChunk->freeBlocks > 0);      
  return soa_chunk_alloc(allocator->allocChunk,allocator->blockSize);
}